

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall flatbuffers::swift::SwiftGenerator::GenEnum(SwiftGenerator *this,EnumDef *enum_def)

{
  bool bVar1;
  Value *pVVar2;
  char *pcVar3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar4;
  reference ppEVar5;
  EnumVal *pEVar6;
  bool local_639;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  string local_428;
  allocator<char> local_401;
  string local_400;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  string local_370;
  allocator<char> local_349;
  string local_348;
  string local_328;
  allocator<char> local_301;
  string local_300;
  EnumVal *local_2e0;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_2d0;
  const_iterator it;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  allocator<char> local_161;
  string local_160;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  EnumDef *pEStack_18;
  bool is_private_access;
  EnumDef *enum_def_local;
  SwiftGenerator *this_local;
  
  if (((enum_def->super_Definition).generated & 1U) == 0) {
    local_42 = 0;
    local_55 = 0;
    local_639 = true;
    pEStack_18 = enum_def;
    enum_def_local = (EnumDef *)this;
    if (((((this->super_BaseGenerator).parser_)->opts).swift_implementation_only & 1U) == 0) {
      std::allocator<char>::allocator();
      local_42 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"private",&local_41);
      local_55 = 1;
      pVVar2 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(enum_def->super_Definition).attributes,&local_40);
      local_639 = pVVar2 != (Value *)0x0;
    }
    if ((local_55 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    if ((local_42 & 1) != 0) {
      std::allocator<char>::~allocator(&local_41);
    }
    local_19 = local_639;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"ENUM_TYPE",&local_79);
    pcVar3 = "Enum, Verifiable";
    if ((pEStack_18->is_union & 1U) != 0) {
      pcVar3 = "UnionEnum";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar3,&local_a1);
    CodeWriter::SetValue(&this->code_,&local_78,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"ACCESS_TYPE",&local_c9);
    pcVar3 = "public";
    if ((local_19 & 1) != 0) {
      pcVar3 = "internal";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar3,&local_f1);
    CodeWriter::SetValue(&this->code_,&local_c8,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"ENUM_NAME",&local_119);
    IdlNamer::NamespacedType_abi_cxx11_(&local_140,&this->namer_,&pEStack_18->super_Definition);
    CodeWriter::SetValue(&this->code_,&local_118,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"BASE_TYPE",&local_161);
    GenTypeBasic_abi_cxx11_(&local_188,this,&pEStack_18->underlying_type,false);
    CodeWriter::SetValue(&this->code_,&local_160,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    GenComment(this,&(pEStack_18->super_Definition).doc_comment);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,
               "{{ACCESS_TYPE}} enum {{ENUM_NAME}}: {{BASE_TYPE}}, {{ENUM_TYPE}} {",&local_1a9);
    CodeWriter::operator+=(&this->code_,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    Indent(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"{{ACCESS_TYPE}} typealias T = {{BASE_TYPE}}",&local_1d1);
    CodeWriter::operator+=(&this->code_,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    if ((pEStack_18->is_union & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
      CodeWriter::operator+=(&this->code_,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"{{ACCESS_TYPE}} init?(value: T) {",&local_221);
      CodeWriter::operator+=(&this->code_,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      Indent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"self.init(rawValue: value)",&local_249);
      CodeWriter::operator+=(&this->code_,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      Outdent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"}\n",&local_271);
      CodeWriter::operator+=(&this->code_,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,
               "{{ACCESS_TYPE}} static var byteSize: Int { return MemoryLayout<{{BASE_TYPE}}>.size }"
               ,&local_299);
    CodeWriter::operator+=(&this->code_,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,
               "{{ACCESS_TYPE}} var value: {{BASE_TYPE}} { return self.rawValue }",
               (allocator<char> *)((long)&it._M_current + 7));
    CodeWriter::operator+=(&this->code_,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    pvVar4 = EnumDef::Vals(pEStack_18);
    local_2d0._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar4)
    ;
    while( true ) {
      pvVar4 = EnumDef::Vals(pEStack_18);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar4)
      ;
      bVar1 = __gnu_cxx::operator!=
                        (&local_2d0,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar1) break;
      ppEVar5 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_2d0);
      local_2e0 = *ppEVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"KEY",&local_301);
      IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_328,&this->namer_,local_2e0);
      CodeWriter::SetValue(&this->code_,&local_300,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"VALUE",&local_349);
      EnumDef::ToString_abi_cxx11_(&local_370,pEStack_18,local_2e0);
      CodeWriter::SetValue(&this->code_,&local_348,&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
      GenComment(this,&local_2e0->doc_comment);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"case {{KEY}} = {{VALUE}}",&local_391);
      CodeWriter::operator+=(&this->code_,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator(&local_391);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_2d0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"",&local_3b9);
    CodeWriter::operator+=(&this->code_,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    pEVar6 = EnumDef::MaxValue(pEStack_18);
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_3e0,&this->namer_,pEVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"max",&local_401);
    AddMinOrMaxEnumValue(this,&local_3e0,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    std::__cxx11::string::~string((string *)&local_3e0);
    pEVar6 = EnumDef::MinValue(pEStack_18);
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_428,&this->namer_,pEVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"min",&local_449);
    AddMinOrMaxEnumValue(this,&local_428,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    std::__cxx11::string::~string((string *)&local_428);
    Outdent(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"}\n",&local_471);
    CodeWriter::operator+=(&this->code_,&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    if (((((this->super_BaseGenerator).parser_)->opts).gen_json_coders & 1U) != 0) {
      EnumEncoder(this,pEStack_18);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"",&local_499);
    CodeWriter::operator+=(&this->code_,&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    std::allocator<char>::~allocator(&local_499);
    if ((((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) &&
       ((pEStack_18->is_union & 1U) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"{{ACCESS_TYPE}} struct {{ENUM_NAME}}Union {",&local_4c1);
      CodeWriter::operator+=(&this->code_,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      Indent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,"{{ACCESS_TYPE}} var type: {{ENUM_NAME}}",&local_4e9);
      CodeWriter::operator+=(&this->code_,&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"{{ACCESS_TYPE}} var value: NativeObject?",&local_511);
      CodeWriter::operator+=(&this->code_,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,
                 "{{ACCESS_TYPE}} init(_ v: NativeObject?, type: {{ENUM_NAME}}) {",&local_539);
      CodeWriter::operator+=(&this->code_,&local_538);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator(&local_539);
      Indent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,"self.type = type",&local_561);
      CodeWriter::operator+=(&this->code_,&local_560);
      std::__cxx11::string::~string((string *)&local_560);
      std::allocator<char>::~allocator(&local_561);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_588,"self.value = v",&local_589);
      CodeWriter::operator+=(&this->code_,&local_588);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator(&local_589);
      Outdent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"}",&local_5b1);
      CodeWriter::operator+=(&this->code_,&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::allocator<char>::~allocator(&local_5b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d8,
                 "{{ACCESS_TYPE}} func pack(builder: inout FlatBufferBuilder) -> Offset {",
                 &local_5d9);
      CodeWriter::operator+=(&this->code_,&local_5d8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::allocator<char>::~allocator(&local_5d9);
      Indent(this);
      BuildUnionEnumSwitchCaseWritter(this,pEStack_18);
      Outdent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"}",&local_601);
      CodeWriter::operator+=(&this->code_,&local_600);
      std::__cxx11::string::~string((string *)&local_600);
      std::allocator<char>::~allocator(&local_601);
      Outdent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"}",&local_629);
      CodeWriter::operator+=(&this->code_,&local_628);
      std::__cxx11::string::~string((string *)&local_628);
      std::allocator<char>::~allocator(&local_629);
    }
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def) {
    if (enum_def.generated) return;
    const bool is_private_access =
        parser_.opts.swift_implementation_only ||
        enum_def.attributes.Lookup("private") != nullptr;
    code_.SetValue("ENUM_TYPE",
                   enum_def.is_union ? "UnionEnum" : "Enum, Verifiable");
    code_.SetValue("ACCESS_TYPE", is_private_access ? "internal" : "public");
    code_.SetValue("ENUM_NAME", namer_.NamespacedType(enum_def));
    code_.SetValue("BASE_TYPE", GenTypeBasic(enum_def.underlying_type, false));
    GenComment(enum_def.doc_comment);
    code_ +=
        "{{ACCESS_TYPE}} enum {{ENUM_NAME}}: {{BASE_TYPE}}, {{ENUM_TYPE}} {";
    Indent();
    code_ += "{{ACCESS_TYPE}} typealias T = {{BASE_TYPE}}";
    if (enum_def.is_union) {
      code_ += "";
      code_ += "{{ACCESS_TYPE}} init?(value: T) {";
      Indent();
      code_ += "self.init(rawValue: value)";
      Outdent();
      code_ += "}\n";
    }
    code_ +=
        "{{ACCESS_TYPE}} static var byteSize: Int { return "
        "MemoryLayout<{{BASE_TYPE}}>.size "
        "}";
    code_ +=
        "{{ACCESS_TYPE}} var value: {{BASE_TYPE}} { return self.rawValue }";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const auto &ev = **it;
      code_.SetValue("KEY", namer_.LegacySwiftVariant(ev));
      code_.SetValue("VALUE", enum_def.ToString(ev));
      GenComment(ev.doc_comment);
      code_ += "case {{KEY}} = {{VALUE}}";
    }
    code_ += "";
    AddMinOrMaxEnumValue(namer_.LegacySwiftVariant(*enum_def.MaxValue()),
                         "max");
    AddMinOrMaxEnumValue(namer_.LegacySwiftVariant(*enum_def.MinValue()),
                         "min");
    Outdent();
    code_ += "}\n";
    if (parser_.opts.gen_json_coders) EnumEncoder(enum_def);
    code_ += "";
    if (parser_.opts.generate_object_based_api && enum_def.is_union) {
      code_ += "{{ACCESS_TYPE}} struct {{ENUM_NAME}}Union {";
      Indent();
      code_ += "{{ACCESS_TYPE}} var type: {{ENUM_NAME}}";
      code_ += "{{ACCESS_TYPE}} var value: NativeObject?";
      code_ +=
          "{{ACCESS_TYPE}} init(_ v: NativeObject?, type: {{ENUM_NAME}}) {";
      Indent();
      code_ += "self.type = type";
      code_ += "self.value = v";
      Outdent();
      code_ += "}";
      code_ +=
          "{{ACCESS_TYPE}} func pack(builder: inout FlatBufferBuilder) -> "
          "Offset {";
      Indent();
      BuildUnionEnumSwitchCaseWritter(enum_def);
      Outdent();
      code_ += "}";
      Outdent();
      code_ += "}";
    }
  }